

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O1

void deqp::gles3::Functional::FboTestUtil::readPixels
               (Context *ctx,Surface *dst,int x,int y,int width,int height,TextureFormat *format,
               Vec4 *scale,Vec4 *bias)

{
  int i;
  int iVar1;
  TransferFormat TVar2;
  long lVar3;
  uint rowPitch;
  int y_00;
  void *data_00;
  Vector<float,_4> res_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  TextureFormat readFormat;
  Vector<float,_4> res;
  undefined1 local_90 [16];
  ConstPixelBufferAccess src;
  PixelBufferAccess dstAccess;
  
  readFormat = getFramebufferReadFormat(format);
  TVar2 = glu::getTransferFormat(readFormat);
  iVar1 = tcu::TextureFormat::getPixelSize(&readFormat);
  rowPitch = iVar1 * width + 3U & 0xfffffffc;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&data,(long)(int)(rowPitch * height),(allocator_type *)&src);
  (*ctx->_vptr_Context[0x78])
            (ctx,(ulong)(uint)x,(ulong)(uint)y,width,(ulong)(uint)height,(ulong)TVar2 & 0xffffffff,
             (ulong)TVar2 >> 0x20,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&src,&readFormat,width,height,1,rowPitch,0,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  tcu::Surface::setSize(dst,width,height);
  res_1.m_data[0] = 1.12104e-44;
  res_1.m_data[1] = 4.2039e-45;
  data_00 = (void *)(dst->m_pixels).m_cap;
  if (data_00 != (void *)0x0) {
    data_00 = (dst->m_pixels).m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&dstAccess,(TextureFormat *)&res_1,dst->m_width,dst->m_height,1,data_00);
  if (0 < height) {
    iVar1 = 0;
    do {
      if (0 < width) {
        y_00 = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_90,(int)&src,y_00,iVar1);
          res.m_data[0] = 0.0;
          res.m_data[1] = 0.0;
          res.m_data[2] = 0.0;
          res.m_data[3] = 0.0;
          lVar3 = 0;
          do {
            res.m_data[lVar3] = *(float *)(local_90 + lVar3 * 4) * scale->m_data[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 4);
          res_1.m_data[0] = 0.0;
          res_1.m_data[1] = 0.0;
          res_1.m_data[2] = 0.0;
          res_1.m_data[3] = 0.0;
          lVar3 = 0;
          do {
            res_1.m_data[lVar3] = res.m_data[lVar3] + bias->m_data[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 4);
          tcu::PixelBufferAccess::setPixel(&dstAccess,&res_1,y_00,iVar1,0);
          y_00 = y_00 + 1;
        } while (y_00 != width);
      }
      iVar1 = iVar1 + 1;
    } while (iVar1 != height);
  }
  if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void readPixels (sglr::Context& ctx, tcu::Surface& dst, int x, int y, int width, int height, const tcu::TextureFormat& format, const tcu::Vec4& scale, const tcu::Vec4& bias)
{
	tcu::TextureFormat		readFormat		= getFramebufferReadFormat(format);
	glu::TransferFormat		transferFmt		= glu::getTransferFormat(readFormat);
	int						alignment		= 4; // \note GL_PACK_ALIGNMENT = 4 is assumed.
	int						rowSize			= deAlign32(readFormat.getPixelSize()*width, alignment);
	vector<deUint8>			data			(rowSize*height);

	ctx.readPixels(x, y, width, height, transferFmt.format, transferFmt.dataType, &data[0]);

	// Convert to surface.
	tcu::ConstPixelBufferAccess src(readFormat, width, height, 1, rowSize, 0, &data[0]);

	dst.setSize(width, height);
	tcu::PixelBufferAccess dstAccess = dst.getAccess();

	for (int yo = 0; yo < height; yo++)
	for (int xo = 0; xo < width; xo++)
		dstAccess.setPixel(src.getPixel(xo, yo) * scale + bias, xo, yo);
}